

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::emit_store_statement
          (CompilerMSL *this,uint32_t lhs_expression,uint32_t rhs_expression)

{
  char cVar1;
  Variant *pVVar2;
  CompilerMSL *pCVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  SPIRType *pSVar8;
  SPIRType *pSVar9;
  SPIRVariable *pSVar10;
  SPIRType *type;
  ulong uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  long *plVar13;
  size_type *psVar14;
  byte bVar15;
  char *in_R8;
  char *in_R9;
  char (*pacVar16) [3];
  char (*pacVar17) [2];
  uint local_3a0;
  uint local_39c;
  CompilerMSL *local_398;
  SPIRExpression *local_390;
  string rhs_row;
  string unpacked_expr;
  SPIRExpression *local_340;
  string cast_expr;
  char *packed_pfx;
  string local_310;
  string cast_addr_space;
  SPIRType vector_type;
  SPIRType write_type;
  
  uVar11 = (ulong)lhs_expression;
  pSVar8 = Compiler::expression_type((Compiler *)this,rhs_expression);
  bVar4 = Compiler::has_extended_decoration
                    ((Compiler *)this,lhs_expression,SPIRVCrossDecorationPhysicalTypeID);
  bVar5 = Compiler::has_extended_decoration
                    ((Compiler *)this,lhs_expression,SPIRVCrossDecorationPhysicalTypePacked);
  if ((uVar11 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr, pVVar2[uVar11].type == TypeExpression)) {
    local_390 = Variant::get<spirv_cross::SPIRExpression>(pVVar2 + uVar11);
  }
  else {
    local_390 = (SPIRExpression *)0x0;
  }
  uVar11 = (ulong)rhs_expression;
  if ((uVar11 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr, pVVar2[uVar11].type == TypeExpression)) {
    local_340 = Variant::get<spirv_cross::SPIRExpression>(pVVar2 + uVar11);
  }
  else {
    local_340 = (SPIRExpression *)0x0;
  }
  if (local_390 == (SPIRExpression *)0x0) {
    bVar15 = 0;
  }
  else {
    bVar15 = local_390->need_transpose;
  }
  local_398 = this;
  if (!bVar4 && !bVar5) {
    bVar4 = Compiler::is_matrix((Compiler *)this,pSVar8);
    pCVar3 = local_398;
    if (((local_390 == (SPIRExpression *)0x0) || (!bVar4)) || (local_390->need_transpose != true)) {
      if ((local_390 == (SPIRExpression *)0x0) || (local_390->need_transpose != true))
      goto LAB_002a4cad;
      local_390->need_transpose = false;
      cast_expr._M_dataplus._M_p = cast_expr._M_dataplus._M_p & 0xffffffff00000000;
      if (pSVar8->vecsize != 0) {
        do {
          CompilerGLSL::to_dereferenced_expression_abi_cxx11_
                    ((string *)&write_type,&local_398->super_CompilerGLSL,lhs_expression,true);
          uVar11 = ::std::__cxx11::string::rfind((char)&write_type,0x5b);
          if (uVar11 != 0xffffffffffffffff) {
            rhs_row._M_dataplus._M_p._0_1_ = 0x5b;
            unpacked_expr._M_dataplus._M_p._0_1_ = 0x5d;
            join<char,unsigned_int&,char>
                      ((string *)&vector_type,(spirv_cross *)&rhs_row,(char *)&cast_expr,
                       (uint *)&unpacked_expr,in_R8);
            pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ::std::__cxx11::string::replace
                                ((ulong)&write_type,uVar11,(char *)0x0,
                                 (ulong)vector_type.super_IVariant._vptr_IVariant);
            CompilerGLSL::to_extract_component_expression_abi_cxx11_
                      (&cast_addr_space,&pCVar3->super_CompilerGLSL,rhs_expression,
                       (uint32_t)cast_expr._M_dataplus._M_p);
            in_R8 = ";";
            CompilerGLSL::
            statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                      (&pCVar3->super_CompilerGLSL,pbVar12,(char (*) [4])0x35ef26,&cast_addr_space,
                       (char (*) [2])0x347553);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)cast_addr_space._M_dataplus._M_p != &cast_addr_space.field_2) {
              operator_delete(cast_addr_space._M_dataplus._M_p);
            }
            if (vector_type.super_IVariant._vptr_IVariant != (_func_int **)&vector_type.width) {
              operator_delete(vector_type.super_IVariant._vptr_IVariant);
            }
          }
          if (write_type.super_IVariant._vptr_IVariant != (_func_int **)&write_type.width) {
            operator_delete(write_type.super_IVariant._vptr_IVariant);
          }
          uVar7 = (uint32_t)cast_expr._M_dataplus._M_p + 1;
          cast_expr._M_dataplus._M_p._0_4_ = uVar7;
        } while (uVar7 < pSVar8->vecsize);
      }
      local_390->need_transpose = true;
      this = local_398;
    }
    else {
      local_390->need_transpose = false;
      if ((local_340 == (SPIRExpression *)0x0) || (local_340->need_transpose != true)) {
        CompilerGLSL::to_expression_abi_cxx11_
                  ((string *)&write_type,&this->super_CompilerGLSL,lhs_expression,true);
        CompilerGLSL::to_unpacked_expression_abi_cxx11_
                  ((string *)&vector_type,&this->super_CompilerGLSL,rhs_expression,true);
        CompilerGLSL::
        statement<std::__cxx11::string,char_const(&)[14],std::__cxx11::string,char_const(&)[3]>
                  (&this->super_CompilerGLSL,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&write_type,
                   (char (*) [14])" = transpose(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vector_type
                   ,(char (*) [3])0x347552);
        if (vector_type.super_IVariant._vptr_IVariant != (_func_int **)&vector_type.width) {
          operator_delete(vector_type.super_IVariant._vptr_IVariant);
        }
        if (write_type.super_IVariant._vptr_IVariant != (_func_int **)&write_type.width) {
          operator_delete(write_type.super_IVariant._vptr_IVariant);
        }
      }
      else {
        local_340->need_transpose = false;
        CompilerGLSL::to_expression_abi_cxx11_
                  ((string *)&write_type,&this->super_CompilerGLSL,lhs_expression,true);
        CompilerGLSL::to_unpacked_row_major_matrix_expression_abi_cxx11_
                  ((string *)&vector_type,&this->super_CompilerGLSL,rhs_expression);
        CompilerGLSL::
        statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&write_type,
                   (char (*) [4])0x35ef26,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vector_type
                   ,(char (*) [2])0x347553);
        if (vector_type.super_IVariant._vptr_IVariant != (_func_int **)&vector_type.width) {
          operator_delete(vector_type.super_IVariant._vptr_IVariant);
        }
        if (write_type.super_IVariant._vptr_IVariant != (_func_int **)&write_type.width) {
          operator_delete(write_type.super_IVariant._vptr_IVariant);
        }
        local_340->need_transpose = true;
      }
      local_390->need_transpose = true;
    }
    Compiler::register_write((Compiler *)this,lhs_expression);
    return;
  }
  if (bVar4) {
LAB_002a491d:
    uVar7 = Compiler::get_extended_decoration
                      ((Compiler *)this,lhs_expression,SPIRVCrossDecorationPhysicalTypeID);
  }
  else {
    bVar6 = Compiler::is_matrix((Compiler *)this,pSVar8);
    if (!bVar6 && (bVar15 & 1) == 0) {
LAB_002a4cad:
      CompilerGLSL::emit_store_statement(&this->super_CompilerGLSL,lhs_expression,rhs_expression);
      return;
    }
    if (bVar4) goto LAB_002a491d;
    uVar7 = (pSVar8->super_IVariant).self.id;
  }
  pSVar9 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr + uVar7);
  cast_addr_space._M_dataplus._M_p = (pointer)&cast_addr_space.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&cast_addr_space,"thread","");
  pSVar10 = Compiler::maybe_get_backing_variable((Compiler *)this,lhs_expression);
  if (pSVar10 != (SPIRVariable *)0x0) {
    type = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(pSVar10->super_IVariant).field_0xc);
    get_type_address_space_abi_cxx11_((string *)&write_type,this,type,lhs_expression,false);
    ::std::__cxx11::string::operator=((string *)&cast_addr_space,(string *)&write_type);
    if (write_type.super_IVariant._vptr_IVariant != (_func_int **)&write_type.width) {
      operator_delete(write_type.super_IVariant._vptr_IVariant);
    }
  }
  bVar4 = Compiler::is_matrix((Compiler *)this,pSVar8);
  if (bVar4) {
    packed_pfx = "";
    if (bVar5) {
      packed_pfx = "packed_";
    }
    if (local_340 == (SPIRExpression *)0x0) {
      cVar1 = '\0';
    }
    else {
      cVar1 = local_340->need_transpose;
    }
    SPIRType::SPIRType(&write_type,pSVar8);
    cast_expr._M_dataplus._M_p = (pointer)&cast_expr.field_2;
    cast_expr._M_string_length = 0;
    cast_expr.field_2._M_local_buf[0] = '\0';
    if (cVar1 != '\0') {
      local_340->need_transpose = false;
    }
    if (bVar15 == 0) {
      write_type.columns = 1;
      if (pSVar9->vecsize != pSVar8->vecsize) {
        pacVar16 = (char (*) [3])0x2a53dd;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&rhs_row,this,&write_type,0);
        join<char_const(&)[2],std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string,char_const(&)[3]>
                  ((string *)&vector_type,(spirv_cross *)0x35f5ef,(char (*) [2])&cast_addr_space,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x348c37,
                   (char (*) [2])&packed_pfx,(char **)&rhs_row,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x347b56,
                   pacVar16);
        ::std::__cxx11::string::operator=((string *)&cast_expr,(string *)&vector_type);
        if (vector_type.super_IVariant._vptr_IVariant != (_func_int **)&vector_type.width) {
          operator_delete(vector_type.super_IVariant._vptr_IVariant);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)rhs_row._M_dataplus._M_p != &rhs_row.field_2) {
          operator_delete(rhs_row._M_dataplus._M_p);
        }
      }
      pCVar3 = local_398;
      if (cVar1 == '\0') {
        unpacked_expr._M_dataplus._M_p._0_4_ = 0;
        this = local_398;
        if (pSVar8->columns != 0) {
          do {
            CompilerGLSL::to_enclosed_expression_abi_cxx11_
                      ((string *)&vector_type,&pCVar3->super_CompilerGLSL,lhs_expression,true);
            CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                      (&rhs_row,&pCVar3->super_CompilerGLSL,rhs_expression,true);
            CompilerGLSL::
            statement<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[3]>
                      (&pCVar3->super_CompilerGLSL,&cast_expr,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &vector_type,(char (*) [2])0x3464bc,(uint *)&unpacked_expr,
                       (char (*) [2])0x33ea72,(char (*) [4])0x35ef26,&rhs_row,(char (*) [2])0x3464bc
                       ,(uint *)&unpacked_expr,(char (*) [3])0x34ae56);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)rhs_row._M_dataplus._M_p != &rhs_row.field_2) {
              operator_delete(rhs_row._M_dataplus._M_p);
            }
            if (vector_type.super_IVariant._vptr_IVariant != (_func_int **)&vector_type.width) {
              operator_delete(vector_type.super_IVariant._vptr_IVariant);
            }
            unpacked_expr._M_dataplus._M_p._0_4_ = (uint)unpacked_expr._M_dataplus._M_p + 1;
            this = local_398;
          } while ((uint)unpacked_expr._M_dataplus._M_p < pSVar8->columns);
        }
      }
      else {
        pSVar9 = Compiler::expression_type((Compiler *)this,rhs_expression);
        SPIRType::SPIRType(&vector_type,pSVar9);
        pCVar3 = local_398;
        vector_type.columns = 1;
        local_39c = 0;
        if (pSVar8->columns != 0) {
          do {
            CompilerGLSL::type_to_glsl_constructor_abi_cxx11_
                      (&unpacked_expr,&local_398->super_CompilerGLSL,&vector_type);
            plVar13 = (long *)::std::__cxx11::string::append((char *)&unpacked_expr);
            rhs_row._M_dataplus._M_p = (pointer)&rhs_row.field_2;
            psVar14 = (size_type *)(plVar13 + 2);
            if ((size_type *)*plVar13 == psVar14) {
              rhs_row.field_2._M_allocated_capacity = *psVar14;
              rhs_row.field_2._8_8_ = plVar13[3];
            }
            else {
              rhs_row.field_2._M_allocated_capacity = *psVar14;
              rhs_row._M_dataplus._M_p = (pointer)*plVar13;
            }
            rhs_row._M_string_length = plVar13[1];
            *plVar13 = (long)psVar14;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,
                            (uint)unpacked_expr._M_dataplus._M_p) != &unpacked_expr.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,
                                       (uint)unpacked_expr._M_dataplus._M_p));
            }
            local_3a0 = 0;
            if (vector_type.vecsize != 0) {
              do {
                pacVar17 = (char (*) [2])0x2a556d;
                CompilerGLSL::to_unpacked_row_major_matrix_expression_abi_cxx11_
                          (&unpacked_expr,&local_398->super_CompilerGLSL,rhs_expression);
                join<std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[2]>
                          (&local_310,(spirv_cross *)&unpacked_expr,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x3464bc,(char (*) [2])&local_3a0,(uint *)"][",(char (*) [3])&local_39c,
                           (uint *)0x33ea72,pacVar17);
                ::std::__cxx11::string::_M_append
                          ((char *)&rhs_row,
                           CONCAT44(local_310._M_dataplus._M_p._4_4_,
                                    (uint)local_310._M_dataplus._M_p));
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_310._M_dataplus._M_p._4_4_,(uint)local_310._M_dataplus._M_p)
                    != &local_310.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(local_310._M_dataplus._M_p._4_4_,
                                           (uint)local_310._M_dataplus._M_p));
                }
                if (local_3a0 + 1 < vector_type.vecsize) {
                  ::std::__cxx11::string::append((char *)&rhs_row);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,
                                (uint)unpacked_expr._M_dataplus._M_p) != &unpacked_expr.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,
                                           (uint)unpacked_expr._M_dataplus._M_p));
                }
                local_3a0 = local_3a0 + 1;
              } while (local_3a0 < vector_type.vecsize);
            }
            ::std::__cxx11::string::append((char *)&rhs_row);
            CompilerGLSL::to_enclosed_expression_abi_cxx11_
                      (&unpacked_expr,&pCVar3->super_CompilerGLSL,lhs_expression,true);
            CompilerGLSL::
            statement<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                      (&pCVar3->super_CompilerGLSL,&cast_expr,&unpacked_expr,(char (*) [2])0x3464bc,
                       &local_39c,(char (*) [2])0x33ea72,(char (*) [4])0x35ef26,&rhs_row,
                       (char (*) [2])0x347553);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,
                            (uint)unpacked_expr._M_dataplus._M_p) != &unpacked_expr.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,
                                       (uint)unpacked_expr._M_dataplus._M_p));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)rhs_row._M_dataplus._M_p != &rhs_row.field_2) {
              operator_delete(rhs_row._M_dataplus._M_p);
            }
            local_39c = local_39c + 1;
          } while (local_39c < pSVar8->columns);
        }
        vector_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_003d8230;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&vector_type.member_name_cache._M_h);
        vector_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
        if ((AlignedBuffer<unsigned_int,_8UL> *)
            vector_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
            &vector_type.member_type_index_redirection.stack_storage) {
          free(vector_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
        }
        this = local_398;
        vector_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
        buffer_size = 0;
        if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
            vector_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            ptr != &vector_type.member_types.stack_storage) {
          free(vector_type.member_types.
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr);
        }
        vector_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
        if ((AlignedBuffer<bool,_8UL> *)vector_type.array_size_literal.super_VectorView<bool>.ptr !=
            &vector_type.array_size_literal.stack_storage) {
          free(vector_type.array_size_literal.super_VectorView<bool>.ptr);
        }
        vector_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
        if ((AlignedBuffer<unsigned_int,_8UL> *)vector_type.array.super_VectorView<unsigned_int>.ptr
            != &vector_type.array.stack_storage) {
          free(vector_type.array.super_VectorView<unsigned_int>.ptr);
        }
      }
    }
    else {
      local_390->need_transpose = false;
      write_type.columns = 1;
      write_type.vecsize = pSVar8->columns;
      if (pSVar9->columns != pSVar8->columns) {
        pacVar16 = (char (*) [3])0x2a5232;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&rhs_row,this,&write_type,0);
        join<char_const(&)[2],std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string,char_const(&)[3]>
                  ((string *)&vector_type,(spirv_cross *)0x35f5ef,(char (*) [2])&cast_addr_space,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x348c37,
                   (char (*) [2])&packed_pfx,(char **)&rhs_row,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x347b56,
                   pacVar16);
        ::std::__cxx11::string::operator=((string *)&cast_expr,(string *)&vector_type);
        if (vector_type.super_IVariant._vptr_IVariant != (_func_int **)&vector_type.width) {
          operator_delete(vector_type.super_IVariant._vptr_IVariant);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)rhs_row._M_dataplus._M_p != &rhs_row.field_2) {
          operator_delete(rhs_row._M_dataplus._M_p);
        }
      }
      pCVar3 = local_398;
      if (cVar1 == '\0') {
        pSVar9 = Compiler::expression_type((Compiler *)this,rhs_expression);
        SPIRType::SPIRType(&vector_type,pSVar9);
        pCVar3 = local_398;
        vector_type.vecsize = vector_type.columns;
        vector_type.columns = 1;
        local_39c = 0;
        if (pSVar8->vecsize != 0) {
          do {
            CompilerGLSL::type_to_glsl_constructor_abi_cxx11_
                      (&unpacked_expr,&local_398->super_CompilerGLSL,&vector_type);
            plVar13 = (long *)::std::__cxx11::string::append((char *)&unpacked_expr);
            rhs_row._M_dataplus._M_p = (pointer)&rhs_row.field_2;
            psVar14 = (size_type *)(plVar13 + 2);
            if ((size_type *)*plVar13 == psVar14) {
              rhs_row.field_2._M_allocated_capacity = *psVar14;
              rhs_row.field_2._8_8_ = plVar13[3];
            }
            else {
              rhs_row.field_2._M_allocated_capacity = *psVar14;
              rhs_row._M_dataplus._M_p = (pointer)*plVar13;
            }
            rhs_row._M_string_length = plVar13[1];
            *plVar13 = (long)psVar14;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,
                            (uint)unpacked_expr._M_dataplus._M_p) != &unpacked_expr.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,
                                       (uint)unpacked_expr._M_dataplus._M_p));
            }
            local_3a0 = 0;
            if (vector_type.vecsize != 0) {
              do {
                pacVar17 = (char (*) [2])0x2a5937;
                CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                          (&local_310,&local_398->super_CompilerGLSL,rhs_expression,true);
                join<std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[2]>
                          (&unpacked_expr,(spirv_cross *)&local_310,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x3464bc,(char (*) [2])&local_3a0,(uint *)"][",(char (*) [3])&local_39c,
                           (uint *)0x33ea72,pacVar17);
                ::std::__cxx11::string::_M_append
                          ((char *)&rhs_row,
                           CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,
                                    (uint)unpacked_expr._M_dataplus._M_p));
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,
                                (uint)unpacked_expr._M_dataplus._M_p) != &unpacked_expr.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,
                                           (uint)unpacked_expr._M_dataplus._M_p));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_310._M_dataplus._M_p._4_4_,(uint)local_310._M_dataplus._M_p)
                    != &local_310.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(local_310._M_dataplus._M_p._4_4_,
                                           (uint)local_310._M_dataplus._M_p));
                }
                if (local_3a0 + 1 < vector_type.vecsize) {
                  ::std::__cxx11::string::append((char *)&rhs_row);
                }
                local_3a0 = local_3a0 + 1;
              } while (local_3a0 < vector_type.vecsize);
            }
            ::std::__cxx11::string::append((char *)&rhs_row);
            CompilerGLSL::to_enclosed_expression_abi_cxx11_
                      (&unpacked_expr,&pCVar3->super_CompilerGLSL,lhs_expression,true);
            CompilerGLSL::
            statement<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                      (&pCVar3->super_CompilerGLSL,&cast_expr,&unpacked_expr,(char (*) [2])0x3464bc,
                       &local_39c,(char (*) [2])0x33ea72,(char (*) [4])0x35ef26,&rhs_row,
                       (char (*) [2])0x347553);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,
                            (uint)unpacked_expr._M_dataplus._M_p) != &unpacked_expr.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,
                                       (uint)unpacked_expr._M_dataplus._M_p));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)rhs_row._M_dataplus._M_p != &rhs_row.field_2) {
              operator_delete(rhs_row._M_dataplus._M_p);
            }
            local_39c = local_39c + 1;
          } while (local_39c < pSVar8->vecsize);
        }
        vector_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_003d8230;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&vector_type.member_name_cache._M_h);
        vector_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
        if ((AlignedBuffer<unsigned_int,_8UL> *)
            vector_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
            &vector_type.member_type_index_redirection.stack_storage) {
          free(vector_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
        }
        this = local_398;
        vector_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
        buffer_size = 0;
        if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
            vector_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            ptr != &vector_type.member_types.stack_storage) {
          free(vector_type.member_types.
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr);
        }
        vector_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
        if ((AlignedBuffer<bool,_8UL> *)vector_type.array_size_literal.super_VectorView<bool>.ptr !=
            &vector_type.array_size_literal.stack_storage) {
          free(vector_type.array_size_literal.super_VectorView<bool>.ptr);
        }
        vector_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
        if ((AlignedBuffer<unsigned_int,_8UL> *)vector_type.array.super_VectorView<unsigned_int>.ptr
            != &vector_type.array.stack_storage) {
          free(vector_type.array.super_VectorView<unsigned_int>.ptr);
        }
      }
      else {
        unpacked_expr._M_dataplus._M_p._0_4_ = 0;
        this = local_398;
        if (pSVar8->vecsize != 0) {
          do {
            CompilerGLSL::to_enclosed_expression_abi_cxx11_
                      ((string *)&vector_type,&pCVar3->super_CompilerGLSL,lhs_expression,true);
            CompilerGLSL::to_unpacked_row_major_matrix_expression_abi_cxx11_
                      (&rhs_row,&pCVar3->super_CompilerGLSL,rhs_expression);
            CompilerGLSL::
            statement<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[3]>
                      (&pCVar3->super_CompilerGLSL,&cast_expr,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &vector_type,(char (*) [2])0x3464bc,(uint *)&unpacked_expr,
                       (char (*) [2])0x33ea72,(char (*) [4])0x35ef26,&rhs_row,(char (*) [2])0x3464bc
                       ,(uint *)&unpacked_expr,(char (*) [3])0x34ae56);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)rhs_row._M_dataplus._M_p != &rhs_row.field_2) {
              operator_delete(rhs_row._M_dataplus._M_p);
            }
            if (vector_type.super_IVariant._vptr_IVariant != (_func_int **)&vector_type.width) {
              operator_delete(vector_type.super_IVariant._vptr_IVariant);
            }
            unpacked_expr._M_dataplus._M_p._0_4_ = (uint)unpacked_expr._M_dataplus._M_p + 1;
            this = local_398;
          } while ((uint)unpacked_expr._M_dataplus._M_p < pSVar8->vecsize);
        }
      }
      local_390->need_transpose = true;
    }
    if (cVar1 != '\0') {
      local_340->need_transpose = true;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cast_expr._M_dataplus._M_p != &cast_expr.field_2) {
      operator_delete(cast_expr._M_dataplus._M_p);
    }
    write_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_003d8230;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&write_type.member_name_cache._M_h);
    write_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
    if ((AlignedBuffer<unsigned_int,_8UL> *)
        write_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
        &write_type.member_type_index_redirection.stack_storage) {
      free(write_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
    }
    write_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
    buffer_size = 0;
    if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
        write_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
        != &write_type.member_types.stack_storage) {
      free(write_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
           ptr);
    }
    write_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
    if ((AlignedBuffer<bool,_8UL> *)write_type.array_size_literal.super_VectorView<bool>.ptr !=
        &write_type.array_size_literal.stack_storage) {
      free(write_type.array_size_literal.super_VectorView<bool>.ptr);
    }
    write_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
    if ((AlignedBuffer<unsigned_int,_8UL> *)write_type.array.super_VectorView<unsigned_int>.ptr ==
        &write_type.array.stack_storage) goto LAB_002a5cc6;
  }
  else {
    if (bVar15 == 0) {
      bVar4 = Compiler::is_matrix((Compiler *)this,pSVar9);
      if (((bVar4) || (bVar4 = Compiler::is_array((Compiler *)this,pSVar9), bVar4)) &&
         (pSVar8->vecsize < pSVar9->vecsize)) {
        if (2 < pSVar8->vecsize - 1) {
          __assert_fail("type.vecsize >= 1 && type.vecsize <= 3",
                        "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x1357,
                        "virtual void spirv_cross::CompilerMSL::emit_store_statement(uint32_t, uint32_t)"
                       );
        }
        if (bVar5) {
          __assert_fail("!lhs_packed_type",
                        "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x135d,
                        "virtual void spirv_cross::CompilerMSL::emit_store_statement(uint32_t, uint32_t)"
                       );
        }
        CompilerGLSL::to_dereferenced_expression_abi_cxx11_
                  ((string *)&write_type,&this->super_CompilerGLSL,lhs_expression,true);
        CompilerGLSL::to_pointer_expression_abi_cxx11_
                  ((string *)&vector_type,&this->super_CompilerGLSL,rhs_expression,true);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&rhs_row,this,pSVar8,0);
        pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2a4ff4;
        CompilerGLSL::enclose_expression
                  (&unpacked_expr,&this->super_CompilerGLSL,(string *)&write_type);
        join<char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string>
                  (&cast_expr,(spirv_cross *)0x35f5ef,(char (*) [2])&cast_addr_space,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x348c37,
                   (char (*) [2])&rhs_row,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x347b56,
                   (char (*) [3])&unpacked_expr,pbVar12);
        ::std::__cxx11::string::operator=((string *)&write_type,(string *)&cast_expr);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)cast_expr._M_dataplus._M_p != &cast_expr.field_2) {
          operator_delete(cast_expr._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,(uint)unpacked_expr._M_dataplus._M_p)
            != &unpacked_expr.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,
                                   (uint)unpacked_expr._M_dataplus._M_p));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)rhs_row._M_dataplus._M_p != &rhs_row.field_2) {
          operator_delete(rhs_row._M_dataplus._M_p);
        }
        pSVar8 = Compiler::expression_type((Compiler *)this,rhs_expression);
        bVar4 = CompilerGLSL::optimize_read_modify_write
                          (&this->super_CompilerGLSL,pSVar8,(string *)&write_type,
                           (string *)&vector_type);
        if (!bVar4) {
          CompilerGLSL::
          statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                    (&this->super_CompilerGLSL,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &write_type,(char (*) [4])0x35ef26,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vector_type,(char (*) [2])0x347553);
        }
        if (vector_type.super_IVariant._vptr_IVariant != (_func_int **)&vector_type.width) {
          operator_delete(vector_type.super_IVariant._vptr_IVariant);
        }
        if (write_type.super_IVariant._vptr_IVariant == (_func_int **)&write_type.width)
        goto LAB_002a5cc6;
      }
      else {
        bVar4 = Compiler::is_matrix((Compiler *)this,pSVar8);
        if (bVar4) goto LAB_002a5cc6;
        CompilerGLSL::to_dereferenced_expression_abi_cxx11_
                  ((string *)&write_type,&this->super_CompilerGLSL,lhs_expression,true);
        CompilerGLSL::to_pointer_expression_abi_cxx11_
                  ((string *)&vector_type,&this->super_CompilerGLSL,rhs_expression,true);
        pSVar8 = Compiler::expression_type((Compiler *)this,rhs_expression);
        bVar4 = CompilerGLSL::optimize_read_modify_write
                          (&this->super_CompilerGLSL,pSVar8,(string *)&write_type,
                           (string *)&vector_type);
        if (!bVar4) {
          CompilerGLSL::
          statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                    (&this->super_CompilerGLSL,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &write_type,(char (*) [4])0x35ef26,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vector_type,(char (*) [2])0x347553);
        }
        if (vector_type.super_IVariant._vptr_IVariant != (_func_int **)&vector_type.width) {
          operator_delete(vector_type.super_IVariant._vptr_IVariant);
        }
        if (write_type.super_IVariant._vptr_IVariant == (_func_int **)&write_type.width)
        goto LAB_002a5cc6;
      }
      operator_delete(write_type.super_IVariant._vptr_IVariant);
      goto LAB_002a5cc6;
    }
    local_390->need_transpose = false;
    SPIRType::SPIRType(&write_type,pSVar8);
    pCVar3 = local_398;
    write_type.vecsize = 1;
    write_type.columns = 1;
    local_310._M_dataplus._M_p._0_4_ = 0;
    if (pSVar8->vecsize != 0) {
      do {
        CompilerGLSL::to_enclosed_expression_abi_cxx11_
                  ((string *)&vector_type,&this->super_CompilerGLSL,lhs_expression,true);
        uVar11 = ::std::__cxx11::string::rfind((char)&vector_type,0x5b);
        if (uVar11 != 0xffffffffffffffff) {
          (*(local_398->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&cast_expr,local_398,&write_type,0);
          packed_pfx = (char *)CONCAT71(packed_pfx._1_7_,0x5b);
          local_39c = CONCAT31(local_39c._1_3_,0x5d);
          join<char,unsigned_int&,char,char_const(&)[2]>
                    (&rhs_row,(spirv_cross *)&packed_pfx,(char *)&local_310,&local_39c,")",
                     (char (*) [2])in_R9);
          pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ::std::__cxx11::string::replace
                              ((ulong)&vector_type,uVar11,(char *)0x0,
                               (ulong)rhs_row._M_dataplus._M_p);
          CompilerGLSL::to_extract_component_expression_abi_cxx11_
                    (&unpacked_expr,&pCVar3->super_CompilerGLSL,rhs_expression,
                     (uint)local_310._M_dataplus._M_p);
          in_R9 = "*)&";
          CompilerGLSL::
          statement<char_const(&)[3],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                    (&pCVar3->super_CompilerGLSL,(char (*) [3])0x352693,&cast_addr_space,
                     (char (*) [2])0x348c37,&cast_expr,(char (*) [4])"*)&",pbVar12,
                     (char (*) [4])0x35ef26,&unpacked_expr,(char (*) [2])0x347553);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,(uint)unpacked_expr._M_dataplus._M_p)
              != &unpacked_expr.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,
                                     (uint)unpacked_expr._M_dataplus._M_p));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)rhs_row._M_dataplus._M_p != &rhs_row.field_2) {
            operator_delete(rhs_row._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)cast_expr._M_dataplus._M_p != &cast_expr.field_2) {
            operator_delete(cast_expr._M_dataplus._M_p);
          }
        }
        if (vector_type.super_IVariant._vptr_IVariant != (_func_int **)&vector_type.width) {
          operator_delete(vector_type.super_IVariant._vptr_IVariant);
        }
        local_310._M_dataplus._M_p._0_4_ = (uint)local_310._M_dataplus._M_p + 1;
        this = local_398;
      } while ((uint)local_310._M_dataplus._M_p < pSVar8->vecsize);
    }
    local_390->need_transpose = true;
    write_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_003d8230;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&write_type.member_name_cache._M_h);
    write_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
    if ((AlignedBuffer<unsigned_int,_8UL> *)
        write_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
        &write_type.member_type_index_redirection.stack_storage) {
      free(write_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
    }
    write_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
    buffer_size = 0;
    if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
        write_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
        != &write_type.member_types.stack_storage) {
      free(write_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
           ptr);
    }
    write_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
    if ((AlignedBuffer<bool,_8UL> *)write_type.array_size_literal.super_VectorView<bool>.ptr !=
        &write_type.array_size_literal.stack_storage) {
      free(write_type.array_size_literal.super_VectorView<bool>.ptr);
    }
    write_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
    if ((AlignedBuffer<unsigned_int,_8UL> *)write_type.array.super_VectorView<unsigned_int>.ptr ==
        &write_type.array.stack_storage) goto LAB_002a5cc6;
  }
  write_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
  free(write_type.array.super_VectorView<unsigned_int>.ptr);
LAB_002a5cc6:
  Compiler::register_write((Compiler *)this,lhs_expression);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cast_addr_space._M_dataplus._M_p != &cast_addr_space.field_2) {
    operator_delete(cast_addr_space._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerMSL::emit_store_statement(uint32_t lhs_expression, uint32_t rhs_expression)
{
	auto &type = expression_type(rhs_expression);

	bool lhs_remapped_type = has_extended_decoration(lhs_expression, SPIRVCrossDecorationPhysicalTypeID);
	bool lhs_packed_type = has_extended_decoration(lhs_expression, SPIRVCrossDecorationPhysicalTypePacked);
	auto *lhs_e = maybe_get<SPIRExpression>(lhs_expression);
	auto *rhs_e = maybe_get<SPIRExpression>(rhs_expression);

	bool transpose = lhs_e && lhs_e->need_transpose;

	// No physical type remapping, and no packed type, so can just emit a store directly.
	if (!lhs_remapped_type && !lhs_packed_type)
	{
		// We might not be dealing with remapped physical types or packed types,
		// but we might be doing a clean store to a row-major matrix.
		// In this case, we just flip transpose states, and emit the store, a transpose must be in the RHS expression, if any.
		if (is_matrix(type) && lhs_e && lhs_e->need_transpose)
		{
			lhs_e->need_transpose = false;

			if (rhs_e && rhs_e->need_transpose)
			{
				// Direct copy, but might need to unpack RHS.
				// Skip the transpose, as we will transpose when writing to LHS and transpose(transpose(T)) == T.
				rhs_e->need_transpose = false;
				statement(to_expression(lhs_expression), " = ", to_unpacked_row_major_matrix_expression(rhs_expression),
				          ";");
				rhs_e->need_transpose = true;
			}
			else
				statement(to_expression(lhs_expression), " = transpose(", to_unpacked_expression(rhs_expression), ");");

			lhs_e->need_transpose = true;
			register_write(lhs_expression);
		}
		else if (lhs_e && lhs_e->need_transpose)
		{
			lhs_e->need_transpose = false;

			// Storing a column to a row-major matrix. Unroll the write.
			for (uint32_t c = 0; c < type.vecsize; c++)
			{
				auto lhs_expr = to_dereferenced_expression(lhs_expression);
				auto column_index = lhs_expr.find_last_of('[');
				if (column_index != string::npos)
				{
					statement(lhs_expr.insert(column_index, join('[', c, ']')), " = ",
					          to_extract_component_expression(rhs_expression, c), ";");
				}
			}
			lhs_e->need_transpose = true;
			register_write(lhs_expression);
		}
		else
			CompilerGLSL::emit_store_statement(lhs_expression, rhs_expression);
	}
	else if (!lhs_remapped_type && !is_matrix(type) && !transpose)
	{
		// Even if the target type is packed, we can directly store to it. We cannot store to packed matrices directly,
		// since they are declared as array of vectors instead, and we need the fallback path below.
		CompilerGLSL::emit_store_statement(lhs_expression, rhs_expression);
	}
	else
	{
		// Special handling when storing to a remapped physical type.
		// This is mostly to deal with std140 padded matrices or vectors.

		TypeID physical_type_id = lhs_remapped_type ?
		                              ID(get_extended_decoration(lhs_expression, SPIRVCrossDecorationPhysicalTypeID)) :
		                              type.self;

		auto &physical_type = get<SPIRType>(physical_type_id);

		string cast_addr_space = "thread";
		auto *p_var_lhs = maybe_get_backing_variable(lhs_expression);
		if (p_var_lhs)
			cast_addr_space = get_type_address_space(get<SPIRType>(p_var_lhs->basetype), lhs_expression);

		if (is_matrix(type))
		{
			const char *packed_pfx = lhs_packed_type ? "packed_" : "";

			// Packed matrices are stored as arrays of packed vectors, so we need
			// to assign the vectors one at a time.
			// For row-major matrices, we need to transpose the *right-hand* side,
			// not the left-hand side.

			// Lots of cases to cover here ...

			bool rhs_transpose = rhs_e && rhs_e->need_transpose;
			SPIRType write_type = type;
			string cast_expr;

			// We're dealing with transpose manually.
			if (rhs_transpose)
				rhs_e->need_transpose = false;

			if (transpose)
			{
				// We're dealing with transpose manually.
				lhs_e->need_transpose = false;
				write_type.vecsize = type.columns;
				write_type.columns = 1;

				if (physical_type.columns != type.columns)
					cast_expr = join("(", cast_addr_space, " ", packed_pfx, type_to_glsl(write_type), "&)");

				if (rhs_transpose)
				{
					// If RHS is also transposed, we can just copy row by row.
					for (uint32_t i = 0; i < type.vecsize; i++)
					{
						statement(cast_expr, to_enclosed_expression(lhs_expression), "[", i, "]", " = ",
						          to_unpacked_row_major_matrix_expression(rhs_expression), "[", i, "];");
					}
				}
				else
				{
					auto vector_type = expression_type(rhs_expression);
					vector_type.vecsize = vector_type.columns;
					vector_type.columns = 1;

					// Transpose on the fly. Emitting a lot of full transpose() ops and extracting lanes seems very bad,
					// so pick out individual components instead.
					for (uint32_t i = 0; i < type.vecsize; i++)
					{
						string rhs_row = type_to_glsl_constructor(vector_type) + "(";
						for (uint32_t j = 0; j < vector_type.vecsize; j++)
						{
							rhs_row += join(to_enclosed_unpacked_expression(rhs_expression), "[", j, "][", i, "]");
							if (j + 1 < vector_type.vecsize)
								rhs_row += ", ";
						}
						rhs_row += ")";

						statement(cast_expr, to_enclosed_expression(lhs_expression), "[", i, "]", " = ", rhs_row, ";");
					}
				}

				// We're dealing with transpose manually.
				lhs_e->need_transpose = true;
			}
			else
			{
				write_type.columns = 1;

				if (physical_type.vecsize != type.vecsize)
					cast_expr = join("(", cast_addr_space, " ", packed_pfx, type_to_glsl(write_type), "&)");

				if (rhs_transpose)
				{
					auto vector_type = expression_type(rhs_expression);
					vector_type.columns = 1;

					// Transpose on the fly. Emitting a lot of full transpose() ops and extracting lanes seems very bad,
					// so pick out individual components instead.
					for (uint32_t i = 0; i < type.columns; i++)
					{
						string rhs_row = type_to_glsl_constructor(vector_type) + "(";
						for (uint32_t j = 0; j < vector_type.vecsize; j++)
						{
							// Need to explicitly unpack expression since we've mucked with transpose state.
							auto unpacked_expr = to_unpacked_row_major_matrix_expression(rhs_expression);
							rhs_row += join(unpacked_expr, "[", j, "][", i, "]");
							if (j + 1 < vector_type.vecsize)
								rhs_row += ", ";
						}
						rhs_row += ")";

						statement(cast_expr, to_enclosed_expression(lhs_expression), "[", i, "]", " = ", rhs_row, ";");
					}
				}
				else
				{
					// Copy column-by-column.
					for (uint32_t i = 0; i < type.columns; i++)
					{
						statement(cast_expr, to_enclosed_expression(lhs_expression), "[", i, "]", " = ",
						          to_enclosed_unpacked_expression(rhs_expression), "[", i, "];");
					}
				}
			}

			// We're dealing with transpose manually.
			if (rhs_transpose)
				rhs_e->need_transpose = true;
		}
		else if (transpose)
		{
			lhs_e->need_transpose = false;

			SPIRType write_type = type;
			write_type.vecsize = 1;
			write_type.columns = 1;

			// Storing a column to a row-major matrix. Unroll the write.
			for (uint32_t c = 0; c < type.vecsize; c++)
			{
				auto lhs_expr = to_enclosed_expression(lhs_expression);
				auto column_index = lhs_expr.find_last_of('[');
				if (column_index != string::npos)
				{
					statement("((", cast_addr_space, " ", type_to_glsl(write_type), "*)&",
					          lhs_expr.insert(column_index, join('[', c, ']', ")")), " = ",
					          to_extract_component_expression(rhs_expression, c), ";");
				}
			}

			lhs_e->need_transpose = true;
		}
		else if ((is_matrix(physical_type) || is_array(physical_type)) && physical_type.vecsize > type.vecsize)
		{
			assert(type.vecsize >= 1 && type.vecsize <= 3);

			// If we have packed types, we cannot use swizzled stores.
			// We could technically unroll the store for each element if needed.
			// When remapping to a std140 physical type, we always get float4,
			// and the packed decoration should always be removed.
			assert(!lhs_packed_type);

			string lhs = to_dereferenced_expression(lhs_expression);
			string rhs = to_pointer_expression(rhs_expression);

			// Unpack the expression so we can store to it with a float or float2.
			// It's still an l-value, so it's fine. Most other unpacking of expressions turn them into r-values instead.
			lhs = join("(", cast_addr_space, " ", type_to_glsl(type), "&)", enclose_expression(lhs));
			if (!optimize_read_modify_write(expression_type(rhs_expression), lhs, rhs))
				statement(lhs, " = ", rhs, ";");
		}
		else if (!is_matrix(type))
		{
			string lhs = to_dereferenced_expression(lhs_expression);
			string rhs = to_pointer_expression(rhs_expression);
			if (!optimize_read_modify_write(expression_type(rhs_expression), lhs, rhs))
				statement(lhs, " = ", rhs, ";");
		}

		register_write(lhs_expression);
	}
}